

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readCStyleComment(Reader *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar2 = this->end_;
  pcVar4 = this->current_;
  do {
    pcVar3 = pcVar4 + 1;
    if (pcVar2 <= pcVar3) break;
  } while (((pcVar4 == pcVar2) ||
           (this->current_ = pcVar3, cVar1 = *pcVar4, pcVar4 = pcVar3, cVar1 != '*')) ||
          (*pcVar3 != '/'));
  pcVar4 = this->current_;
  if (pcVar4 == pcVar2) {
    return false;
  }
  this->current_ = pcVar4 + 1;
  return *pcVar4 == '/';
}

Assistant:

bool Reader::readCStyleComment() {
  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
  }
  return getNextChar() == '/';
}